

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

bool tcu::anon_unknown_3::verifyMultisamplePointGroupRasterization
               (Surface *surface,PointSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector<float,_4> local_1a8;
  Vector<float,_4> local_198;
  Vector<float,_4> local_188;
  Vector<float,_4> local_178;
  Vector<float,_4> local_168;
  Vector<float,_4> local_158;
  Vector<float,_2> local_148;
  Vector<float,_2> local_140;
  Vector<float,_2> local_138;
  Vector<float,_2> local_130;
  Vector<float,_2> local_128;
  Vector<float,_2> local_120;
  Vector<float,_2> local_118;
  Vector<float,_2> local_110;
  Vector<float,_2> local_108;
  Vector<float,_2> local_100;
  Vector<float,_2> local_f8;
  Vector<float,_2> local_f0;
  Vector<float,_2> local_e8;
  Vector<float,_2> local_e0;
  Vector<float,_2> local_d8;
  Vector<float,_2> local_d0;
  Vector<float,_2> local_c8;
  Vector<float,_2> local_c0;
  Vector<float,_2> local_b8;
  Vector<float,_2> local_b0;
  Vector<float,_2> local_a8;
  Vec2 lineQuadNormalizedDeviceSpace [4];
  float offset;
  Vector<float,_2> local_78;
  Vector<float,_2> local_70;
  Vector<float,_2> local_68;
  Vec2 pointScreenSpace;
  Vec2 pointNormalizedDeviceSpace;
  int pointNdx;
  undefined1 local_48 [8];
  TriangleSceneSpec triangleScene;
  Vec2 viewportSize;
  TestLog *log_local;
  RasterizationArguments *args_local;
  PointSceneSpec *scene_local;
  Surface *surface_local;
  
  iVar2 = Surface::getWidth(surface);
  iVar3 = Surface::getHeight(surface);
  Vector<float,_2>::Vector
            ((Vector<float,_2> *)
             &triangleScene.triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(float)iVar2,(float)iVar3);
  TriangleSceneSpec::TriangleSceneSpec((TriangleSceneSpec *)local_48);
  sVar4 = std::
          vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          ::size(&scene->points);
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            *)local_48,sVar4 * 2);
  pointNormalizedDeviceSpace.m_data[0] = 0.0;
  while( true ) {
    sVar4 = std::
            vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
            ::size(&scene->points);
    if ((int)sVar4 <= (int)pointNormalizedDeviceSpace.m_data[0]) break;
    pvVar5 = std::
             vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
             ::operator[](&scene->points,(long)(int)pointNormalizedDeviceSpace.m_data[0]);
    fVar7 = Vector<float,_4>::x(&pvVar5->position);
    pvVar5 = std::
             vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
             ::operator[](&scene->points,(long)(int)pointNormalizedDeviceSpace.m_data[0]);
    fVar8 = Vector<float,_4>::w(&pvVar5->position);
    pvVar5 = std::
             vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
             ::operator[](&scene->points,(long)(int)pointNormalizedDeviceSpace.m_data[0]);
    fVar9 = Vector<float,_4>::y(&pvVar5->position);
    pvVar5 = std::
             vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
             ::operator[](&scene->points,(long)(int)pointNormalizedDeviceSpace.m_data[0]);
    fVar10 = Vector<float,_4>::w(&pvVar5->position);
    Vector<float,_2>::Vector(&pointScreenSpace,fVar7 / fVar8,fVar9 / fVar10);
    Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xffffffffffffff80,1.0,1.0);
    tcu::operator+((tcu *)&local_78,&pointScreenSpace,(Vector<float,_2> *)&stack0xffffffffffffff80);
    tcu::operator*((tcu *)&local_70,&local_78,0.5);
    tcu::operator*((tcu *)&local_68,&local_70,
                   (Vector<float,_2> *)
                   &triangleScene.triangles.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar5 = std::
             vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
             ::operator[](&scene->points,(long)(int)pointNormalizedDeviceSpace.m_data[0]);
    lineQuadNormalizedDeviceSpace[3].m_data[1] = pvVar5->pointSize * 0.5;
    Vector<float,_2>::Vector
              (&local_c8,-lineQuadNormalizedDeviceSpace[3].m_data[1],
               -lineQuadNormalizedDeviceSpace[3].m_data[1]);
    tcu::operator+((tcu *)&local_c0,&local_68,&local_c8);
    tcu::operator/((tcu *)&local_b8,&local_c0,
                   (Vector<float,_2> *)
                   &triangleScene.triangles.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::operator*((tcu *)&local_b0,&local_b8,2.0);
    Vector<float,_2>::Vector(&local_d0,1.0,1.0);
    tcu::operator-((tcu *)&local_a8,&local_b0,&local_d0);
    Vector<float,_2>::Vector
              (&local_f0,-lineQuadNormalizedDeviceSpace[3].m_data[1],
               lineQuadNormalizedDeviceSpace[3].m_data[1]);
    tcu::operator+((tcu *)&local_e8,&local_68,&local_f0);
    tcu::operator/((tcu *)&local_e0,&local_e8,
                   (Vector<float,_2> *)
                   &triangleScene.triangles.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::operator*((tcu *)&local_d8,&local_e0,2.0);
    Vector<float,_2>::Vector(&local_f8,1.0,1.0);
    tcu::operator-((tcu *)lineQuadNormalizedDeviceSpace,&local_d8,&local_f8);
    Vector<float,_2>::Vector
              (&local_118,lineQuadNormalizedDeviceSpace[3].m_data[1],
               lineQuadNormalizedDeviceSpace[3].m_data[1]);
    tcu::operator+((tcu *)&local_110,&local_68,&local_118);
    tcu::operator/((tcu *)&local_108,&local_110,
                   (Vector<float,_2> *)
                   &triangleScene.triangles.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::operator*((tcu *)&local_100,&local_108,2.0);
    Vector<float,_2>::Vector(&local_120,1.0,1.0);
    tcu::operator-((tcu *)(lineQuadNormalizedDeviceSpace + 1),&local_100,&local_120);
    Vector<float,_2>::Vector
              (&local_140,lineQuadNormalizedDeviceSpace[3].m_data[1],
               -lineQuadNormalizedDeviceSpace[3].m_data[1]);
    tcu::operator+((tcu *)&local_138,&local_68,&local_140);
    tcu::operator/((tcu *)&local_130,&local_138,
                   (Vector<float,_2> *)
                   &triangleScene.triangles.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::operator*((tcu *)&local_128,&local_130,2.0);
    Vector<float,_2>::Vector(&local_148,1.0,1.0);
    tcu::operator-((tcu *)(lineQuadNormalizedDeviceSpace + 2),&local_128,&local_148);
    fVar7 = Vector<float,_2>::x(&local_a8);
    fVar8 = Vector<float,_2>::y(&local_a8);
    Vector<float,_4>::Vector(&local_158,fVar7,fVar8,0.0,1.0);
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_48,(long)((int)pointNormalizedDeviceSpace.m_data[0] * 2));
    *(undefined8 *)pvVar6->positions[0].m_data = local_158.m_data._0_8_;
    *(undefined8 *)(pvVar6->positions[0].m_data + 2) = local_158.m_data._8_8_;
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_48,(long)((int)pointNormalizedDeviceSpace.m_data[0] * 2));
    pvVar6->sharedEdge[0] = false;
    fVar7 = Vector<float,_2>::x(lineQuadNormalizedDeviceSpace);
    fVar8 = Vector<float,_2>::y(lineQuadNormalizedDeviceSpace);
    Vector<float,_4>::Vector(&local_168,fVar7,fVar8,0.0,1.0);
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_48,(long)((int)pointNormalizedDeviceSpace.m_data[0] * 2));
    *(undefined8 *)pvVar6->positions[1].m_data = local_168.m_data._0_8_;
    *(undefined8 *)(pvVar6->positions[1].m_data + 2) = local_168.m_data._8_8_;
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_48,(long)((int)pointNormalizedDeviceSpace.m_data[0] * 2));
    pvVar6->sharedEdge[1] = false;
    fVar7 = Vector<float,_2>::x(lineQuadNormalizedDeviceSpace + 1);
    fVar8 = Vector<float,_2>::y(lineQuadNormalizedDeviceSpace + 1);
    Vector<float,_4>::Vector(&local_178,fVar7,fVar8,0.0,1.0);
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_48,(long)((int)pointNormalizedDeviceSpace.m_data[0] * 2));
    *(undefined8 *)pvVar6->positions[2].m_data = local_178.m_data._0_8_;
    *(undefined8 *)(pvVar6->positions[2].m_data + 2) = local_178.m_data._8_8_;
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_48,(long)((int)pointNormalizedDeviceSpace.m_data[0] * 2));
    pvVar6->sharedEdge[2] = true;
    fVar7 = Vector<float,_2>::x(&local_a8);
    fVar8 = Vector<float,_2>::y(&local_a8);
    Vector<float,_4>::Vector(&local_188,fVar7,fVar8,0.0,1.0);
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_48,(long)((int)pointNormalizedDeviceSpace.m_data[0] * 2 + 1));
    *(undefined8 *)pvVar6->positions[0].m_data = local_188.m_data._0_8_;
    *(undefined8 *)(pvVar6->positions[0].m_data + 2) = local_188.m_data._8_8_;
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_48,(long)((int)pointNormalizedDeviceSpace.m_data[0] * 2 + 1));
    pvVar6->sharedEdge[0] = true;
    fVar7 = Vector<float,_2>::x(lineQuadNormalizedDeviceSpace + 1);
    fVar8 = Vector<float,_2>::y(lineQuadNormalizedDeviceSpace + 1);
    Vector<float,_4>::Vector(&local_198,fVar7,fVar8,0.0,1.0);
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_48,(long)((int)pointNormalizedDeviceSpace.m_data[0] * 2 + 1));
    *(undefined8 *)pvVar6->positions[1].m_data = local_198.m_data._0_8_;
    *(undefined8 *)(pvVar6->positions[1].m_data + 2) = local_198.m_data._8_8_;
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_48,(long)((int)pointNormalizedDeviceSpace.m_data[0] * 2 + 1));
    pvVar6->sharedEdge[1] = false;
    fVar7 = Vector<float,_2>::x(lineQuadNormalizedDeviceSpace + 2);
    fVar8 = Vector<float,_2>::y(lineQuadNormalizedDeviceSpace + 2);
    Vector<float,_4>::Vector(&local_1a8,fVar7,fVar8,0.0,1.0);
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_48,(long)((int)pointNormalizedDeviceSpace.m_data[0] * 2 + 1));
    *(undefined8 *)pvVar6->positions[2].m_data = local_1a8.m_data._0_8_;
    *(undefined8 *)(pvVar6->positions[2].m_data + 2) = local_1a8.m_data._8_8_;
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_48,(long)((int)pointNormalizedDeviceSpace.m_data[0] * 2 + 1));
    pvVar6->sharedEdge[2] = false;
    pointNormalizedDeviceSpace.m_data[0] = (float)((int)pointNormalizedDeviceSpace.m_data[0] + 1);
  }
  bVar1 = verifyTriangleGroupRasterization
                    (surface,(TriangleSceneSpec *)local_48,args,log,VERIFICATIONMODE_STRICT);
  TriangleSceneSpec::~TriangleSceneSpec((TriangleSceneSpec *)local_48);
  return bVar1;
}

Assistant:

bool verifyMultisamplePointGroupRasterization (const tcu::Surface& surface, const PointSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	// Multisampled point == 2 triangles

	const tcu::Vec2		viewportSize	= tcu::Vec2((float)surface.getWidth(), (float)surface.getHeight());
	TriangleSceneSpec	triangleScene;

	triangleScene.triangles.resize(2 * scene.points.size());
	for (int pointNdx = 0; pointNdx < (int)scene.points.size(); ++pointNdx)
	{
		// Transform to screen space, add pixel offsets, convert back to normalized device space, and test as triangles
		const tcu::Vec2	pointNormalizedDeviceSpace			= tcu::Vec2(scene.points[pointNdx].position.x() / scene.points[pointNdx].position.w(), scene.points[pointNdx].position.y() / scene.points[pointNdx].position.w());
		const tcu::Vec2	pointScreenSpace					= (pointNormalizedDeviceSpace + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize;
		const float		offset								= scene.points[pointNdx].pointSize * 0.5f;
		const tcu::Vec2	lineQuadNormalizedDeviceSpace[4]	=
		{
			(pointScreenSpace + tcu::Vec2(-offset, -offset))/ viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			(pointScreenSpace + tcu::Vec2(-offset,  offset))/ viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			(pointScreenSpace + tcu::Vec2( offset,  offset))/ viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			(pointScreenSpace + tcu::Vec2( offset, -offset))/ viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
		};

		triangleScene.triangles[pointNdx*2 + 0].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);	triangleScene.triangles[pointNdx*2 + 0].sharedEdge[0] = false;
		triangleScene.triangles[pointNdx*2 + 0].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[1].x(), lineQuadNormalizedDeviceSpace[1].y(), 0.0f, 1.0f);	triangleScene.triangles[pointNdx*2 + 0].sharedEdge[1] = false;
		triangleScene.triangles[pointNdx*2 + 0].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);	triangleScene.triangles[pointNdx*2 + 0].sharedEdge[2] = true;

		triangleScene.triangles[pointNdx*2 + 1].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);	triangleScene.triangles[pointNdx*2 + 1].sharedEdge[0] = true;
		triangleScene.triangles[pointNdx*2 + 1].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);	triangleScene.triangles[pointNdx*2 + 1].sharedEdge[1] = false;
		triangleScene.triangles[pointNdx*2 + 1].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[3].x(), lineQuadNormalizedDeviceSpace[3].y(), 0.0f, 1.0f);	triangleScene.triangles[pointNdx*2 + 1].sharedEdge[2] = false;
	}

	return verifyTriangleGroupRasterization(surface, triangleScene, args, log);
}